

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::texture::anon_unknown_0::Texture2DMipmapTestInstance::iterate
          (TestStatus *__return_storage_ptr__,Texture2DMipmapTestInstance *this)

{
  TextureRenderer *this_00;
  ostringstream *this_01;
  TextureFormat TVar1;
  CoordType CVar2;
  CoordType CVar3;
  FilterMode FVar4;
  TestLog *pTVar5;
  deUint32 dVar6;
  ulong uVar7;
  TestStatus *pTVar8;
  int i;
  deUint32 width;
  deUint32 height;
  deUint32 dVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  TextureFormat TVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Surface *pSVar14;
  ulong uVar15;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  void *pvVar21;
  int cellNdx;
  uint cellNdx_00;
  long lVar22;
  long lVar23;
  ulong uVar24;
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  float *local_460;
  undefined1 local_458 [48];
  vector<float,_std::allocator<float>_> texCoord;
  undefined1 local_410 [40];
  long local_3e8;
  ulong local_3e0;
  ulong local_3d8;
  Surface referenceFrame;
  Surface renderedFrame;
  undefined1 local_3a0 [40];
  Surface errorMask;
  LodPrecision lodPrec;
  Texture2DView local_350;
  TestStatus *local_340;
  long local_338;
  ulong local_330;
  PixelFormat pixelFormat;
  Vector<int,_4> res_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  _Alloc_hider local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8 [6];
  IVec4 formatBitDepth;
  undefined1 local_270 [32];
  _Alloc_hider local_250;
  undefined4 local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_240 [4];
  ios_base local_1f8 [264];
  undefined1 local_f0 [24];
  undefined8 local_d8;
  size_type sStack_d0;
  BVec4 local_c8;
  ReferenceParams refParams;
  
  this_00 = &this->m_renderer;
  width = util::TextureRenderer::getRenderWidth(this_00);
  height = util::TextureRenderer::getRenderHeight(this_00);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&refParams,TEXTURETYPE_2D);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  CVar2 = (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.coordType;
  tcu::Surface::Surface(&renderedFrame,width,height);
  dVar6 = width + 3;
  if (-1 < (int)width) {
    dVar6 = width;
  }
  dVar9 = height + 3;
  if (-1 < (int)height) {
    dVar9 = height;
  }
  util::createSampler((Sampler *)local_270,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,NEAREST);
  refParams.sampler.magFilter = local_270._16_4_;
  refParams.sampler.lodThreshold = (float)local_270._20_4_;
  refParams.sampler.normalizedCoords = (bool)local_270[0x18];
  refParams.sampler._25_3_ = local_270._25_3_;
  refParams.sampler.compare = local_270._28_4_;
  refParams.sampler.wrapS = local_270._0_4_;
  refParams.sampler.wrapT = local_270._4_4_;
  refParams.sampler.wrapR = local_270._8_4_;
  refParams.sampler.minFilter = local_270._12_4_;
  refParams.sampler._32_8_ = local_250._M_p;
  refParams.sampler.borderColor.v.uData[1] = local_248;
  TVar13 = ::vk::mapVkFormat((this->m_testParameters).super_Texture2DTestCaseParameters.
                             super_TextureCommonTestCaseParameters.format);
  refParams.super_RenderParams.samplerType = glu::TextureTestUtil::getSamplerType(TVar13);
  refParams.super_RenderParams.flags =
       (uint)(CVar2 == COORDTYPE_PROJECTED) + (uint)(CVar2 == COORDTYPE_BASIC_BIAS) * 2;
  refParams.lodMode = LODMODE_EXACT;
  local_340 = __return_storage_ptr__;
  if (texture::(anonymous_namespace)::Texture2DMipmapTestInstance::iterate()::s_projections == '\0')
  {
    _GLOBAL__N_1::Texture2DMipmapTestInstance::iterate();
  }
  iVar17 = (int)dVar6 >> 2;
  iVar19 = (int)dVar9 >> 2;
  lVar22 = 0;
  lVar20 = 0;
  local_3e0 = (ulong)height;
  local_3d8 = (ulong)width;
  do {
    iVar10 = iVar19 * (int)lVar20;
    iVar12 = (int)local_3e0 - iVar10;
    if (lVar20 != 3) {
      iVar12 = iVar19;
    }
    iVar18 = 0;
    uVar15 = local_3d8 & 0xffffffff;
    local_460 = (float *)lVar20;
    local_3e8 = lVar22;
    for (lVar23 = 0; uVar7 = local_3d8, uVar24 = local_3e0, lVar23 != 0x40; lVar23 = lVar23 + 0x10)
    {
      iVar16 = iVar17;
      if (lVar23 == 0x30) {
        iVar16 = (int)uVar15;
      }
      CVar3 = (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.coordType;
      cellNdx_00 = (uint)lVar22;
      if (CVar3 < COORDTYPE_AFFINE) {
LAB_0082ef2b:
        getBasicTexCoord2D(&texCoord,cellNdx_00);
      }
      else if (CVar3 == COORDTYPE_AFFINE) {
        getAffineTexCoord2D(&texCoord,cellNdx_00);
      }
      else if (CVar3 == COORDTYPE_PROJECTED) goto LAB_0082ef2b;
      if (CVar2 == COORDTYPE_PROJECTED) {
        refParams.super_RenderParams.w.m_data._0_8_ =
             *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar23);
        refParams.super_RenderParams.w.m_data._8_8_ =
             *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar23 + 8);
      }
      if (CVar2 == COORDTYPE_BASIC_BIAS) {
        refParams.super_RenderParams.bias = iterate::s_bias[cellNdx_00 & 7];
      }
      util::TextureRenderer::setViewport
                (this_00,(float)iVar18,(float)iVar10,(float)iVar16,(float)iVar12);
      lVar22 = lVar22 + 1;
      uVar15 = (ulong)(uint)((int)uVar15 - iVar17);
      iVar18 = iVar18 + iVar17;
      util::TextureRenderer::renderQuad
                (this_00,&renderedFrame,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&refParams);
    }
    lVar20 = (long)local_460 + 1;
    lVar22 = local_3e8 + 4;
  } while (lVar20 != 4);
  local_270._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatBitDepth((tcu *)&formatBitDepth,(TextureFormat *)local_270);
  pixelFormat.redBits = formatBitDepth.m_data[0];
  pixelFormat.greenBits = formatBitDepth.m_data[1];
  pixelFormat.blueBits = formatBitDepth.m_data[2];
  pixelFormat.alphaBits = formatBitDepth.m_data[3];
  FVar4 = (this->m_testParameters).super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.minFilter;
  tcu::Surface::Surface(&referenceFrame,(int)uVar7,(int)uVar24);
  tcu::Surface::Surface(&errorMask,(int)uVar7,(int)uVar24);
  lVar22 = 0;
  do {
    *(undefined4 *)(local_f0 + lVar22 * 4) = 0x16;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 3);
  lVar22 = 3;
  do {
    *(undefined4 *)(local_f0 + lVar22 * 4) = 0x10;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 6);
  local_d8._0_4_ = 0.0;
  local_d8._4_4_ = 0.0;
  sStack_d0._0_4_ = 0.0;
  sStack_d0._4_4_ = 0.0;
  local_c8.m_data[0] = true;
  local_c8.m_data[1] = true;
  local_c8.m_data[2] = true;
  local_c8.m_data[3] = true;
  lodPrec.rule = RULE_VULKAN;
  lodPrec.derivateBits = 0x16;
  lodPrec.lodBits = 0x10;
  local_f0._0_4_ = 0x14;
  local_f0._4_4_ = 0x14;
  local_f0._8_4_ = 0;
  local_f0._12_4_ = 0x10;
  local_f0._16_4_ = 0x10;
  local_f0._20_4_ = 0;
  local_410._0_4_ = pixelFormat.redBits;
  local_410._4_4_ = pixelFormat.greenBits;
  local_410._8_4_ = pixelFormat.blueBits;
  local_410._12_4_ = pixelFormat.alphaBits;
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  res.m_data[3] = 0;
  lVar22 = 0;
  do {
    res.m_data[lVar22] =
         *(int *)(local_410 + lVar22 * 4) +
         (-1 - (uint)((FVar4 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) == 0));
    lVar22 = lVar22 + 1;
  } while (lVar22 != 4);
  local_458._0_4_ = R;
  local_458._4_4_ = SNORM_INT8;
  local_458._8_8_ = 0;
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  res_1.m_data[2] = 0;
  res_1.m_data[3] = 0;
  lVar22 = 0;
  do {
    iVar12 = *(int *)(local_458 + lVar22 * 4);
    if (*(int *)(local_458 + lVar22 * 4) < res.m_data[lVar22]) {
      iVar12 = res.m_data[lVar22];
    }
    res_1.m_data[lVar22] = iVar12;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 4);
  tcu::computeFixedPointThreshold((tcu *)local_270,&res_1);
  local_d8._0_4_ = (float)local_270._0_4_;
  local_d8._4_4_ = (float)local_270._4_4_;
  sStack_d0 = local_270._8_8_;
  local_c8.m_data[1] = 0 < pixelFormat.greenBits;
  local_c8.m_data[0] = 0 < pixelFormat.redBits;
  local_c8.m_data[2] = 0 < pixelFormat.blueBits;
  local_c8.m_data[3] = 0 < pixelFormat.alphaBits;
  lodPrec.derivateBits = 10;
  lodPrec.lodBits = (uint)(CVar2 != COORDTYPE_PROJECTED) * 2 + 6;
  uVar15 = 0;
  lVar22 = 0;
  iVar12 = 0;
  do {
    local_460 = iterate::s_bias + ((uint)uVar15 & 7);
    iVar18 = iVar19 * (int)lVar22;
    iVar10 = (int)local_3e0 - iVar18;
    if (lVar22 != 3) {
      iVar10 = iVar19;
    }
    lVar20 = 0;
    iVar16 = 0;
    uVar24 = local_3d8 & 0xffffffff;
    local_338 = lVar22;
    local_330 = uVar15;
    do {
      local_3e8 = CONCAT44(local_3e8._4_4_,iVar12);
      iVar12 = iVar17;
      if (lVar20 == 0x30) {
        iVar12 = (int)uVar24;
      }
      CVar3 = (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.coordType;
      cellNdx = (int)uVar15;
      if (CVar3 < COORDTYPE_AFFINE) {
LAB_0082f278:
        getBasicTexCoord2D(&texCoord,cellNdx);
      }
      else if (CVar3 == COORDTYPE_AFFINE) {
        getAffineTexCoord2D(&texCoord,cellNdx);
      }
      else if (CVar3 == COORDTYPE_PROJECTED) goto LAB_0082f278;
      if (CVar2 == COORDTYPE_PROJECTED) {
        refParams.super_RenderParams.w.m_data._0_8_ =
             *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar20);
        refParams.super_RenderParams.w.m_data._8_8_ =
             *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar20 + 8);
      }
      if (CVar2 == COORDTYPE_BASIC_BIAS) {
        refParams.super_RenderParams.bias = *local_460;
      }
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)local_270,&referenceFrame,&pixelFormat,iVar16,iVar18,iVar12,iVar10
                );
      iVar11 = (*(((this->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
      res_1.m_data._8_8_ = *(undefined8 *)(CONCAT44(extraout_var,iVar11) + 0x48);
      res_1.m_data[0] = *(int *)(CONCAT44(extraout_var,iVar11) + 0x40);
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)local_270,(Texture2DView *)&res_1,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&refParams);
      res.m_data[0] = 8;
      res.m_data[1] = 3;
      pvVar21 = (void *)renderedFrame.m_pixels.m_cap;
      if (renderedFrame.m_pixels.m_cap != 0) {
        pvVar21 = renderedFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&res_1,(TextureFormat *)&res,renderedFrame.m_width,
                 renderedFrame.m_height,1,pvVar21);
      tcu::getSubregion((PixelBufferAccess *)local_270,(PixelBufferAccess *)&res_1,iVar16,iVar18,
                        iVar12,iVar10);
      local_458._0_4_ = RGBA;
      local_458._4_4_ = UNORM_INT8;
      pvVar21 = (void *)referenceFrame.m_pixels.m_cap;
      if (referenceFrame.m_pixels.m_cap != 0) {
        pvVar21 = referenceFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_410,(TextureFormat *)local_458,referenceFrame.m_width,
                 referenceFrame.m_height,1,pvVar21);
      tcu::getSubregion((PixelBufferAccess *)&res,(PixelBufferAccess *)local_410,iVar16,iVar18,
                        iVar12,iVar10);
      local_350.m_numLevels = 8;
      local_350._4_4_ = 3;
      pvVar21 = (void *)errorMask.m_pixels.m_cap;
      if (errorMask.m_pixels.m_cap != 0) {
        pvVar21 = errorMask.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_3a0,(TextureFormat *)&local_350,errorMask.m_width,
                 errorMask.m_height,1,pvVar21);
      tcu::getSubregion((PixelBufferAccess *)local_458,(PixelBufferAccess *)local_3a0,iVar16,iVar18,
                        iVar12,iVar10);
      iVar12 = (*(((this->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
      local_350.m_levels = *(ConstPixelBufferAccess **)(CONCAT44(extraout_var_00,iVar12) + 0x48);
      local_350.m_numLevels = *(int *)(CONCAT44(extraout_var_00,iVar12) + 0x40);
      iVar12 = glu::TextureTestUtil::computeTextureLookupDiff
                         ((ConstPixelBufferAccess *)local_270,(ConstPixelBufferAccess *)&res,
                          (PixelBufferAccess *)local_458,&local_350,
                          texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,&refParams,(LookupPrecision *)local_f0,
                          &lodPrec,((this->super_TestInstance).m_context)->m_testCtx->m_watchDog);
      iVar12 = (int)local_3e8 + iVar12;
      uVar24 = (ulong)(uint)((int)uVar24 - iVar17);
      iVar16 = iVar16 + iVar17;
      lVar20 = lVar20 + 0x10;
      uVar15 = (ulong)(cellNdx + 1);
      local_460 = local_460 + 1;
    } while (lVar20 != 0x40);
    lVar22 = local_338 + 1;
    uVar15 = (ulong)((int)local_330 + 4);
    if (lVar22 == 4) {
      if (0 < iVar12) {
        local_270._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
        this_01 = (ostringstream *)(local_270 + 8);
        std::__cxx11::ostringstream::ostringstream(this_01);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_01,"ERROR: Image verification failed, found ",0x28);
        std::ostream::operator<<(this_01,iVar12);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_01," invalid pixels!",0x10);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_270,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_01);
        std::ios_base::~ios_base(local_1f8);
      }
      pTVar5 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
      res.m_data._0_8_ = &local_478;
      std::__cxx11::string::_M_construct<char_const*>((string *)&res,"Result","");
      local_410._0_8_ = (long)local_410 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"Verification result","");
      tcu::LogImageSet::LogImageSet((LogImageSet *)&res_1,(string *)&res,(string *)local_410);
      tcu::TestLog::startImageSet(pTVar5,(char *)res_1.m_data._0_8_,local_2f8._M_p);
      local_458._0_8_ = (long)local_458 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"Rendered","");
      TVar13 = (TextureFormat)((long)local_3a0 + 0x10);
      local_3a0._0_8_ = TVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"Rendered image","");
      pSVar14 = &renderedFrame;
      tcu::LogImage::LogImage
                ((LogImage *)local_270,(string *)local_458,(string *)local_3a0,pSVar14,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_270,(int)pTVar5,__buf,(size_t)pSVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_p != aaStack_240) {
        operator_delete(local_250._M_p,
                        CONCAT44(aaStack_240[0]._M_allocated_capacity._4_4_,
                                 (undefined4)aaStack_240[0]._M_allocated_capacity) + 1);
      }
      TVar1 = (TextureFormat)((long)local_270 + 0x10);
      if ((TextureFormat)local_270._0_8_ != TVar1) {
        operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
      }
      if ((TextureFormat)local_3a0._0_8_ != TVar13) {
        operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
      }
      if (local_458._0_8_ != (long)local_458 + 0x10) {
        operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_p != local_2e8) {
        operator_delete(local_2f8._M_p,local_2e8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)res_1.m_data._0_8_ != &local_308) {
        operator_delete((void *)res_1.m_data._0_8_,local_308._M_allocated_capacity + 1);
      }
      if (local_410._0_8_ != (long)local_410 + 0x10) {
        operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)res.m_data._0_8_ != &local_478) {
        operator_delete((void *)res.m_data._0_8_,local_478._M_allocated_capacity + 1);
      }
      if (0 < iVar12) {
        pTVar5 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
        res.m_data._0_8_ = &local_478;
        std::__cxx11::string::_M_construct<char_const*>((string *)&res,"Reference","");
        local_410._0_8_ = (long)local_410 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"Ideal reference","");
        pSVar14 = &referenceFrame;
        tcu::LogImage::LogImage
                  ((LogImage *)local_270,(string *)&res,(string *)local_410,pSVar14,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        iVar19 = (int)pTVar5;
        tcu::LogImage::write((LogImage *)local_270,iVar19,__buf_00,(size_t)pSVar14);
        local_458._0_8_ = (long)local_458 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"ErrorMask","");
        local_3a0._0_8_ = TVar13;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"Error mask","");
        pSVar14 = &errorMask;
        tcu::LogImage::LogImage
                  ((LogImage *)&res_1,(string *)local_458,(string *)local_3a0,pSVar14,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&res_1,iVar19,__buf_01,(size_t)pSVar14);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_p != local_2e8) {
          operator_delete(local_2f8._M_p,local_2e8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)res_1.m_data._0_8_ != &local_308) {
          operator_delete((void *)res_1.m_data._0_8_,local_308._M_allocated_capacity + 1);
        }
        if ((TextureFormat)local_3a0._0_8_ != TVar13) {
          operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
        }
        if (local_458._0_8_ != (long)local_458 + 0x10) {
          operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_p != aaStack_240) {
          operator_delete(local_250._M_p,
                          CONCAT44(aaStack_240[0]._M_allocated_capacity._4_4_,
                                   (undefined4)aaStack_240[0]._M_allocated_capacity) + 1);
        }
        if ((TextureFormat)local_270._0_8_ != TVar1) {
          operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
        }
        if (local_410._0_8_ != (long)local_410 + 0x10) {
          operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)res.m_data._0_8_ != &local_478) {
          operator_delete((void *)res.m_data._0_8_,local_478._M_allocated_capacity + 1);
        }
      }
      tcu::TestLog::endImageSet(((this->super_TestInstance).m_context)->m_testCtx->m_log);
      pTVar8 = local_340;
      local_270._0_8_ = TVar1;
      if (iVar12 == 0) {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"pass","");
        pTVar8->m_code = QP_TEST_RESULT_PASS;
        (pTVar8->m_description)._M_dataplus._M_p = (pointer)&(pTVar8->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pTVar8->m_description,local_270._0_8_,
                   local_270._8_8_ + local_270._0_8_);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"fail","");
        pTVar8->m_code = QP_TEST_RESULT_FAIL;
        (pTVar8->m_description)._M_dataplus._M_p = (pointer)&(pTVar8->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pTVar8->m_description,local_270._0_8_,
                   local_270._8_8_ + local_270._0_8_);
      }
      if ((TextureFormat)local_270._0_8_ != TVar1) {
        operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
      }
      tcu::Surface::~Surface(&errorMask);
      tcu::Surface::~Surface(&referenceFrame);
      tcu::Surface::~Surface(&renderedFrame);
      if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return pTVar8;
    }
  } while( true );
}

Assistant:

tcu::TestStatus Texture2DMipmapTestInstance::iterate (void)
{
	const Sampler::FilterMode	magFilter		= Sampler::NEAREST;
	const int					viewportWidth	= m_renderer.getRenderWidth();
	const int					viewportHeight	= m_renderer.getRenderHeight();

	ReferenceParams				refParams		(TEXTURETYPE_2D);
	vector<float>				texCoord;

	const bool					isProjected		= m_testParameters.coordType == COORDTYPE_PROJECTED;
	const bool					useLodBias		= m_testParameters.coordType == COORDTYPE_BASIC_BIAS;

	tcu::Surface				renderedFrame	(viewportWidth, viewportHeight);

	// Viewport is divided into 4x4 grid.
	const int					gridWidth		= 4;
	const int					gridHeight		= 4;
	const int					cellWidth		= viewportWidth / gridWidth;
	const int					cellHeight		= viewportHeight / gridHeight;

	// Sampling parameters.
	refParams.sampler		= util::createSampler(m_testParameters.wrapS, m_testParameters.wrapT, m_testParameters.minFilter, magFilter);
	refParams.samplerType	= getSamplerType(vk::mapVkFormat(m_testParameters.format));
	refParams.flags			= (isProjected ? ReferenceParams::PROJECTED : 0) | (useLodBias ? ReferenceParams::USE_BIAS : 0);
	refParams.lodMode		= LODMODE_EXACT; // Use ideal lod.

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 2.0f),
		Vec4(0.8f, 1.0f, 1.7f, 0.6f),
		Vec4(1.2f, 1.0f, 1.7f, 1.5f)
	};

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			const int	curX		= cellWidth*gridX;
			const int	curY		= cellHeight*gridY;
			const int	curW		= gridX+1 == gridWidth ? (viewportWidth-curX) : cellWidth;
			const int	curH		= gridY+1 == gridHeight ? (viewportHeight-curY) : cellHeight;
			const int	cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			switch (m_testParameters.coordType)
			{
				case COORDTYPE_BASIC_BIAS:	// Fall-through.
				case COORDTYPE_PROJECTED:
				case COORDTYPE_BASIC:		getBasicTexCoord2D	(texCoord, cellNdx);	break;
				case COORDTYPE_AFFINE:		getAffineTexCoord2D	(texCoord, cellNdx);	break;
				default:					DE_ASSERT(DE_FALSE);
			}

			if (isProjected)
				refParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

			if (useLodBias)
				refParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

			m_renderer.setViewport((float)curX, (float)curY, (float)curW, (float)curH);
			m_renderer.renderQuad(renderedFrame, 0, &texCoord[0], refParams);
		}
	}

	// Compare and log.
	{
		const tcu::IVec4		formatBitDepth	= getTextureFormatBitDepth(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		const tcu::PixelFormat	pixelFormat		(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
		const bool				isTrilinear		= m_testParameters.minFilter == Sampler::NEAREST_MIPMAP_LINEAR || m_testParameters.minFilter == Sampler::LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewportWidth, viewportHeight);
		tcu::Surface			errorMask		(viewportWidth, viewportHeight);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_VULKAN);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 0);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 0); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= isProjected ? 6 : 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int	curX		= cellWidth*gridX;
				const int	curY		= cellHeight*gridY;
				const int	curW		= gridX+1 == gridWidth ? (viewportWidth-curX) : cellWidth;
				const int	curH		= gridY+1 == gridHeight ? (viewportHeight-curY) : cellHeight;
				const int	cellNdx		= gridY*gridWidth + gridX;

				// Compute texcoord.
				switch (m_testParameters.coordType)
				{
					case COORDTYPE_BASIC_BIAS:	// Fall-through.
					case COORDTYPE_PROJECTED:
					case COORDTYPE_BASIC:		getBasicTexCoord2D	(texCoord, cellNdx);	break;
					case COORDTYPE_AFFINE:		getAffineTexCoord2D	(texCoord, cellNdx);	break;
					default:					DE_ASSERT(DE_FALSE);
				}

				if (isProjected)
					refParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

				if (useLodBias)
					refParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  m_texture->getTexture(), &texCoord[0], refParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getTexture(), &texCoord[0], refParams,
															lookupPrec, lodPrec, m_context.getTestContext().getWatchDog());
			}
		}

		if (numFailedPixels > 0)
			m_context.getTestContext().getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_context.getTestContext().getLog() << TestLog::ImageSet("Result", "Verification result")
											<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_context.getTestContext().getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
												<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_context.getTestContext().getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			return isOk ? tcu::TestStatus::pass("pass") : tcu::TestStatus::fail("fail");
		}
	}
}